

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O3

void menu_bar_inter_abort_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object menu_bar_win;
  Am_Object obj;
  Am_Object sub_window;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  local_50.data = (Am_Object_Data *)0x0;
  local_58.data = (Am_Object_Data *)0x0;
  local_48.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)inter,10);
  pAVar2 = Am_Object::Get(&local_20,0x68,0);
  Am_Object::operator=(&local_58,pAVar2);
  Am_Object::~Am_Object(&local_20);
  pAVar2 = Am_Object::Get(inter,0x16b,0);
  Am_Object::operator=(&local_50,pAVar2);
  Am_Object::Am_Object(&local_28,&local_50);
  Am_Object::Am_Object(&local_30,&local_58);
  clear_interim_sel(&local_10,&local_28);
  Am_Object::~Am_Object(&local_10);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_28);
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::operator=(&local_50,pAVar2);
  Am_Object::Am_Object(&local_38,&local_50);
  Am_Object::Am_Object(&local_40,&local_58);
  clear_interim_sel(&local_18,&local_38);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_38);
  pAVar2 = Am_Object::Get(inter,0x1d2,0);
  Am_Object::operator=(&local_48,pAVar2);
  bVar1 = Am_Object::Valid(&local_48);
  if (bVar1) {
    set_sub_window_vis(&local_48,false,&local_58);
  }
  value = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
  Am_Object::Set(inter,0x1d2,value,1);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_50);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, menu_bar_inter_abort,
                 (Am_Object inter))
{
  Am_Object obj, menu_bar_win, sub_window;
  menu_bar_win = inter.Get_Owner().Get(Am_WINDOW);
  obj = inter.Get(Am_OLD_INTERIM_VALUE);
  clear_interim_sel(obj, menu_bar_win);
  obj = inter.Get(Am_INTERIM_VALUE);
  clear_interim_sel(obj, menu_bar_win);
  // now make sub_window go away
  sub_window = inter.Get(Am_SUB_MENU);
  if (sub_window.Valid())
    set_sub_window_vis(sub_window, false, menu_bar_win);
  inter.Set(Am_SUB_MENU, Am_No_Object, Am_OK_IF_NOT_THERE);
}